

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  size_t max;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  byte *pbVar11;
  char *pcVar12;
  byte *__s;
  bool bVar13;
  char *local_38;
  
  if (conn_to_host == (curl_slist *)0x0) {
    return CURLE_OK;
  }
LAB_001249b7:
  pcVar10 = conn_to_host->data;
  if (*pcVar10 == ':') {
LAB_00124a4d:
    if (pcVar10[1] != ':') {
      pcVar12 = strchr(pcVar10 + 1,0x3a);
      if (pcVar12 != (char *)0x0) {
        local_38 = (char *)0x0;
        lVar8 = strtol(pcVar10 + 1,&local_38,10);
        if ((local_38 == pcVar12) && (lVar8 == conn->remote_port)) {
          pcVar10 = pcVar12 + 1;
          goto LAB_00124a5b;
        }
      }
      goto LAB_00124bc2;
    }
    pcVar10 = pcVar10 + 2;
LAB_00124a5b:
    if (*pcVar10 == '\0') goto LAB_00124bc2;
    pbVar6 = (byte *)(*Curl_cstrdup)(pcVar10);
    if (pbVar6 == (byte *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pbVar11 = pbVar6;
    __s = pbVar6;
    if (*pbVar6 == 0x5b) {
      pbVar11 = pbVar6 + 1;
      bVar3 = pbVar6[1];
      __s = pbVar11;
      while (bVar3 != 0) {
        iVar4 = Curl_isxdigit((uint)bVar3);
        if (((iVar4 == 0) && (bVar3 = *__s, bVar3 != 0x2e)) && (bVar3 != 0x3a)) {
          if (bVar3 != 0x25) goto LAB_00124cee;
          uVar5 = (uint)__s[1];
          iVar4 = __s[1] - 0x32;
          if (iVar4 == 0) {
            iVar4 = 0x35 - (uint)__s[2];
          }
          else {
            iVar4 = -iVar4;
          }
          __s = __s + 1;
          if (iVar4 != 0) {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            uVar5 = (uint)*__s;
          }
          goto LAB_00124caa;
        }
        pbVar1 = __s + 1;
        __s = __s + 1;
        bVar3 = *pbVar1;
      }
      goto LAB_00124acb;
    }
    goto LAB_00124ade;
  }
  bVar13 = (*(uint *)&(conn->bits).field_0x4 >> 9 & 1) == 0;
  pcVar12 = "[";
  if (bVar13) {
    pcVar12 = "";
  }
  pcVar9 = "]";
  if (bVar13) {
    pcVar9 = "";
  }
  pcVar12 = curl_maprintf("%s%s%s",pcVar12,(conn->host).name,pcVar9);
  if (pcVar12 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  max = strlen(pcVar12);
  iVar4 = Curl_strncasecompare(pcVar10,pcVar12,max);
  (*Curl_cfree)(pcVar12);
  if ((iVar4 != 0) && (pcVar10[max] == ':')) {
    pcVar10 = pcVar10 + max;
    goto LAB_00124a4d;
  }
  goto LAB_00124bc2;
LAB_00124caa:
  if ((char)uVar5 == '\0') goto LAB_00124acb;
  iVar4 = Curl_isalpha(uVar5);
  if (((iVar4 == 0) && (iVar4 = Curl_isxdigit((uint)*__s), iVar4 == 0)) &&
     ((bVar3 = *__s, 1 < bVar3 - 0x2d && ((bVar3 != 0x7e && (bVar3 != 0x5f)))))) goto LAB_00124cee;
  uVar5 = (uint)__s[1];
  __s = __s + 1;
  goto LAB_00124caa;
LAB_00124cee:
  if (bVar3 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_00124acb:
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_00124ade:
  pcVar10 = strchr((char *)__s,0x3a);
  if (pcVar10 == (char *)0x0) {
LAB_00124c04:
    uVar7 = 0xffffffff;
LAB_00124c0a:
    uVar5 = (uint)uVar7;
    pcVar10 = (*Curl_cstrdup)((char *)pbVar11);
    (*Curl_cfree)(pbVar6);
    if (pcVar10 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (*pcVar10 != '\0') {
      (conn->conn_to_host).rawalloc = pcVar10;
      (conn->conn_to_host).name = pcVar10;
      puVar2 = &(conn->bits).field_0x4;
      *puVar2 = *puVar2 | 4;
      bVar3 = 0;
      Curl_infof(data,"Connecting to hostname: %s\n",pcVar10);
      goto LAB_00124bdb;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar10 = '\0';
    if (pcVar10[1] == '\0') goto LAB_00124c04;
    uVar7 = strtol(pcVar10 + 1,&local_38,10);
    if (((local_38 == (char *)0x0) || (*local_38 == '\0')) && (uVar7 < 0x10000)) goto LAB_00124c0a;
    Curl_infof(data,"No valid port number in connect to host string (%s)\n",pcVar10 + 1);
    (*Curl_cfree)(pbVar6);
LAB_00124bc2:
    uVar5 = 0xffffffff;
    pcVar10 = (char *)0x0;
  }
  puVar2 = &(conn->bits).field_0x4;
  *puVar2 = *puVar2 & 0xfb;
  (*Curl_cfree)(pcVar10);
  bVar3 = 1;
LAB_00124bdb:
  if (-1 < (int)uVar5) {
    conn->conn_to_port = uVar5;
    puVar2 = &(conn->bits).field_0x4;
    *puVar2 = *puVar2 | 8;
    Curl_infof(data,"Connecting to port: %d\n",(ulong)uVar5);
    return CURLE_OK;
  }
  puVar2 = &(conn->bits).field_0x4;
  *puVar2 = *puVar2 & 0xf7;
  conn_to_host = conn_to_host->next;
  if (!(bool)(bVar3 & conn_to_host != (curl_slist *)0x0)) {
    return CURLE_OK;
  }
  goto LAB_001249b7;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s\n", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifdef USE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     (conn->handler->protocol == CURLPROTO_HTTPS)) {
    /* no connect_to match, try alt-svc! */
    const char *nhost;
    int nport;
    enum alpnid nalpnid;
    bool hit;
    host = conn->host.rawalloc;
    hit = Curl_altsvc_lookup(data->asi,
                             ALPN_h1, host, conn->remote_port, /* from */
                             &nalpnid, &nhost, &nport /* to */);
    if(hit) {
      char *hostd = strdup((char *)nhost);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = nport;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d\n",
            Curl_alpnid2str(ALPN_h1), host, conn->remote_port,
            Curl_alpnid2str(nalpnid), hostd, nport);
    }
  }
#endif

  return result;
}